

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.cpp
# Opt level: O1

void notify(string *hello)

{
  long *plVar1;
  long *plVar2;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Hello world: ","");
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_58,(ulong)(hello->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_28 = *plVar2;
    lStack_20 = plVar1[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar2;
    local_38 = (long *)*plVar1;
  }
  local_30 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&notifyResult_abi_cxx11_,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void notify(const std::string &hello) { notifyResult = string("Hello world: ") + hello; }